

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTPNStm * __thiscall CTcParser::parse_if(CTcParser *this,int *err)

{
  CTcTokFileDesc *pCVar1;
  long lVar2;
  tc_toktyp_t tVar3;
  CTcPrsNode *cond_expr;
  CTPNStm *then_part;
  CTPNStm *else_part;
  CTPNStmIf *this_00;
  int *siz;
  
  pCVar1 = G_tok->last_desc_;
  lVar2 = G_tok->last_linenum_;
  tVar3 = CTcTokenizer::next(G_tok);
  if (tVar3 == TOKT_LPAR) {
    CTcTokenizer::next(G_tok);
  }
  else {
    CTcTokenizer::log_error_curtok(G_tok,0x2b23);
  }
  cond_expr = parse_cond_expr(this);
  if (cond_expr == (CTcPrsNode *)0x0) {
    *err = 1;
    this_00 = (CTPNStmIf *)0x0;
  }
  else {
    if ((G_tok->curtok_).typ_ == TOKT_RPAR) {
      CTcTokenizer::next(G_tok);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2bc6);
    }
    this_00 = (CTPNStmIf *)0x0;
    siz = err;
    then_part = parse_stm(this,err,(CTPNStmSwitch *)0x0,0);
    if (*err == 0) {
      if ((G_tok->curtok_).typ_ == TOKT_ELSE) {
        CTcTokenizer::next(G_tok);
        siz = err;
        else_part = parse_stm(this,err,(CTPNStmSwitch *)0x0,0);
        if (*err != 0) {
          return (CTPNStm *)0x0;
        }
      }
      else {
        else_part = (CTPNStm *)0x0;
      }
      this_00 = (CTPNStmIf *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x38,(size_t)siz);
      CTPNStmIf::CTPNStmIf(this_00,cond_expr,then_part,else_part);
      (this_00->super_CTPNStmIfBase).super_CTPNStm.super_CTPNStmBase.file_ = pCVar1;
      (this_00->super_CTPNStmIfBase).super_CTPNStm.super_CTPNStmBase.linenum_ = lVar2;
    }
  }
  return (CTPNStm *)this_00;
}

Assistant:

CTPNStm *CTcParser::parse_if(int *err)
{
    CTcPrsNode *cond_expr;
    CTPNStm *if_stm;
    CTPNStm *then_stm;
    CTPNStm *else_stm;
    CTcTokFileDesc *file;
    long linenum;
    
    /* save the starting line information for later */
    G_tok->get_last_pos(&file, &linenum);

    /* skip the 'if' keyword, and require the open paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip the left paren */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, but proceed on the assumption that they simply
         *   left out the paren 
         */
        G_tok->log_error_curtok(TCERR_REQ_LPAR_IF);
    }

    /* parse the expression */
    cond_expr = parse_cond_expr();

    /* if that failed, return failure */
    if (cond_expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* require the close paren */
    if (G_tok->cur() == TOKT_RPAR)
    {
        /* skip it */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, then proceed assuming that the paren was merely
         *   omitted 
         */
        G_tok->log_error_curtok(TCERR_REQ_RPAR_IF);
    }

    /* parse the true-part statement */
    then_stm = parse_stm(err, 0, FALSE);

    /* if an error occurred, return failure */
    if (*err)
        return 0;

    /* check for 'else' */
    if (G_tok->cur() == TOKT_ELSE)
    {
        /* skip the 'else' keyword */
        G_tok->next();

        /* parse the false-part statement */
        else_stm = parse_stm(err, 0, FALSE);

        /* if an error occurred, return failure */
        if (*err)
            return 0;
    }
    else
    {
        /* there's no 'else' part */
        else_stm = 0;
    }

    /* create and return the 'if' statement node */
    if_stm = new CTPNStmIf(cond_expr, then_stm, else_stm);

    /* set the original statement position in the node */
    if_stm->set_source_pos(file, linenum);

    /* return the 'if' statement node */
    return if_stm;
}